

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O1

void InstructionSet::M68k::Primitive::
     shift<(InstructionSet::M68k::Operation)75,unsigned_int,CPU::MC68000::ProcessorBase>
               (uint32_t source,uint *destination,Status *status,ProcessorBase *flow_controller)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar3 = source & 0x3f;
  flow_controller->dynamic_instruction_length_ = uVar3 + 2;
  if (uVar3 == 0) {
    status->overflow_flag = 0;
    status->carry_flag = 0;
  }
  else {
    if (uVar3 < 0x21) {
      uVar5 = (ulong)((*destination >> (uVar3 - 1 & 0x1f) & 1) != 0);
      status->extend_flag = uVar5;
      status->carry_flag = uVar5;
    }
    else {
      status->carry_flag = 0;
      status->extend_flag = 0;
    }
    status->overflow_flag = 0;
    uVar4 = (int)*destination >> 0x1f;
    bVar1 = (byte)uVar3 & 0x1f;
    uVar2 = *destination >> bVar1 | uVar4 << 0x20 - bVar1;
    if (0x1f < uVar3) {
      uVar2 = uVar4;
    }
    *destination = uVar2;
  }
  uVar3 = *destination;
  status->zero_result = (ulong)uVar3;
  status->negative_flag = (ulong)(uVar3 & 0x80000000);
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}